

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O2

FT_Int t1_get_index(char *name,FT_Offset len,void *user_data)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  T1_Font type1;
  ulong uVar3;
  ulong uVar4;
  
  if (len < 0x10000) {
    uVar4 = (ulong)*(uint *)((long)user_data + 0x188);
    if ((int)*(uint *)((long)user_data + 0x188) < 1) {
      uVar4 = 0;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      __s = *(char **)(*(long *)((long)user_data + 400) + uVar3 * 8);
      if ((((__s != (char *)0x0) && (*__s == *name)) && (sVar2 = strlen(__s), sVar2 == len)) &&
         (iVar1 = strncmp(__s,name,len), iVar1 == 0)) {
        return (FT_Int)uVar3;
      }
    }
  }
  return 0;
}

Assistant:

static FT_Int
  t1_get_index( const char*  name,
                FT_Offset    len,
                void*        user_data )
  {
    T1_Font  type1 = (T1_Font)user_data;
    FT_Int   n;


    /* PS string/name length must be < 16-bit */
    if ( len > 0xFFFFU )
      return 0;

    for ( n = 0; n < type1->num_glyphs; n++ )
    {
      char*  gname = (char*)type1->glyph_names[n];


      if ( gname && gname[0] == name[0]        &&
           ft_strlen( gname ) == len           &&
           ft_strncmp( gname, name, len ) == 0 )
        return n;
    }

    return 0;
  }